

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O1

double __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>
::local_compute_reduced_cost<baryonyx::bit_array>
          (solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>
           *this,int variable,bit_array *x)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 in_XMM4_Qb;
  undefined1 local_28 [16];
  
  sparse_matrix<int>::column((sparse_matrix<int> *)local_28,(int)this + 0x10);
  if (local_28._8_8_ == local_28._0_8_) {
    dVar1 = 0.0;
  }
  else {
    auVar2 = ZEXT816(0);
    auVar3._8_8_ = 0x7fffffffffffffff;
    auVar3._0_8_ = 0x7fffffffffffffff;
    do {
      auVar4._0_8_ = (double)(this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                             _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                             super__Head_base<0UL,_int_*,_false>._M_head_impl
                             [*(int *)local_28._8_8_];
      auVar4._8_8_ = in_XMM4_Qb;
      auVar4 = vandpd_avx(auVar4,auVar3);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (this->pi)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                     _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                     super__Head_base<0UL,_double_*,_false>._M_head_impl
                     [*(int *)(local_28._8_8_ + 4)] +
                     (this->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                     _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                     super__Head_base<0UL,_double_*,_false>._M_head_impl[*(int *)local_28._8_8_];
      auVar2 = vfmadd231sd_fma(auVar2,auVar4,auVar5);
      dVar1 = auVar2._0_8_;
      local_28._8_8_ = local_28._8_8_ + 8;
    } while (local_28._8_8_ != local_28._0_8_);
  }
  return (this->c->linear_elements)._M_t.
         super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl[variable] - dVar1;
}

Assistant:

Float local_compute_reduced_cost(int variable, const Xtype& x) noexcept
    {
        Float sum_a_pi_p = 0;

        for (auto [ht, hte] = ap.column(variable); ht != hte; ++ht) {
            auto a = std::abs(static_cast<Float>(A[ht->value]));
            sum_a_pi_p += a * (pi[ht->row] + P[ht->value]);
        }

        return c(variable, x) - sum_a_pi_p;
    }